

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

string * hostsPath_abi_cxx11_(void)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  configDir_abi_cxx11_();
  path<std::__cxx11::string,char_const*>(in_RDI,&local_30,"hosts");
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string hostsPath() {
    return path(configDir(), "hosts");
}